

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cc
# Opt level: O3

Renderer * __thiscall
SDL2pp::Renderer::FillCopy
          (Renderer *this,Texture *texture,Optional<Rect> *srcrect,Optional<Rect> *dstrect,
          Point *offset,int flip)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  anon_union_16_2_ddbcb137_for___optional_storage<SDL2pp::Rect,_true>_2 local_94;
  undefined1 local_84;
  anon_union_16_2_ddbcb137_for___optional_storage<SDL2pp::Rect,_true>_2 local_80;
  undefined1 local_70;
  uint local_6c;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  Texture *local_50;
  ulong local_48;
  anon_union_8_2_ddbcb137_for___optional_storage<SDL2pp::Point,_true>_2 local_3c;
  undefined1 local_34;
  
  if ((srcrect->super___optional_storage<SDL2pp::Rect,_true>).__engaged_ == true) {
    local_a4 = (srcrect->super___optional_storage<SDL2pp::Rect,_true>).field_0.__val_.super_SDL_Rect
               .x;
    local_ac = (srcrect->super___optional_storage<SDL2pp::Rect,_true>).field_0.__val_.super_SDL_Rect
               .y;
    iVar1 = (srcrect->super___optional_storage<SDL2pp::Rect,_true>).field_0.__val_.super_SDL_Rect.w;
    uVar7 = (srcrect->super___optional_storage<SDL2pp::Rect,_true>).field_0.__val_.super_SDL_Rect.h;
  }
  else {
    iVar1 = Texture::GetWidth(texture);
    uVar7 = Texture::GetHeight(texture);
    local_ac = 0;
    local_a4 = 0;
  }
  local_50 = texture;
  if ((dstrect->super___optional_storage<SDL2pp::Rect,_true>).__engaged_ == true) {
    local_a8 = (dstrect->super___optional_storage<SDL2pp::Rect,_true>).field_0.__val_.super_SDL_Rect
               .x;
    local_b0 = (dstrect->super___optional_storage<SDL2pp::Rect,_true>).field_0.__val_.super_SDL_Rect
               .y;
    iVar2 = (dstrect->super___optional_storage<SDL2pp::Rect,_true>).field_0.__val_.super_SDL_Rect.w;
    local_b4 = (dstrect->super___optional_storage<SDL2pp::Rect,_true>).field_0.__val_.super_SDL_Rect
               .h;
  }
  else {
    iVar2 = GetOutputWidth(this);
    local_b4 = GetOutputHeight(this);
    local_b0 = 0;
    local_a8 = 0;
  }
  uVar4 = (offset->super_SDL_Point).x;
  local_68 = (ulong)uVar4;
  uVar5 = (offset->super_SDL_Point).y;
  local_58 = (ulong)uVar5;
  if (uVar4 + iVar1 == 0 || SCARRY4(uVar4,iVar1) != (int)(uVar4 + iVar1) < 0) {
    local_68 = (long)(int)uVar4 % (long)iVar1 & 0xffffffff;
  }
  if (0 < (int)local_68) {
    local_68 = (ulong)((((int)local_68 + -1 + iVar1) % iVar1 - iVar1) + 1);
  }
  if (uVar5 + uVar7 == 0 || SCARRY4(uVar5,uVar7) != (int)(uVar5 + uVar7) < 0) {
    local_58 = (long)(int)uVar5 % (long)(int)uVar7 & 0xffffffff;
  }
  if (0 < (int)local_58) {
    local_58 = (ulong)(((int)((int)local_58 + -1 + uVar7) % (int)uVar7 - uVar7) + 1);
  }
  uVar4 = (uint)local_58;
  local_60 = (ulong)uVar7;
  while ((int)uVar4 < local_b4) {
    if ((int)local_68 < iVar2) {
      uVar4 = (uint)local_58;
      uVar7 = (int)uVar4 >> 0x1f & uVar4;
      uVar5 = local_ac - uVar7;
      local_48 = (ulong)uVar5;
      iVar8 = uVar7 + (int)local_60;
      uVar7 = 0;
      if (0 < (int)uVar4) {
        uVar7 = uVar4;
      }
      iVar3 = (uVar7 - local_b4) + iVar8;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      iVar8 = iVar8 - iVar3;
      local_6c = ((int)local_60 - uVar5) - iVar8;
      if ((flip & 2U) == 0) {
        local_6c = uVar5;
      }
      uVar9 = local_68 & 0xffffffff;
      do {
        uVar5 = (uint)uVar9;
        uVar4 = (int)uVar5 >> 0x1f & uVar5;
        local_80.__val_.super_SDL_Rect.x = local_a4 - uVar4;
        iVar3 = uVar4 + iVar1;
        uVar4 = 0;
        if (0 < (int)uVar5) {
          uVar4 = uVar5;
        }
        iVar6 = (uVar4 - iVar2) + iVar3;
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        local_94.__val_.super_SDL_Rect.w = iVar3 - iVar6;
        local_94.__val_.super_SDL_Rect.x = uVar4 + local_a8;
        local_94.__val_.super_SDL_Rect.y = uVar7 + local_b0;
        local_94.__val_.super_SDL_Rect.h = iVar8;
        local_80.__val_.super_SDL_Rect.w = local_94.__val_.super_SDL_Rect.w;
        local_80.__val_.super_SDL_Rect.h = iVar8;
        if (flip == 0) {
          local_80.__val_.super_SDL_Rect.y = (int)local_48;
          local_70 = 1;
          local_84 = 1;
          Copy(this,local_50,(Optional<Rect> *)&local_80.__val_,(Optional<Rect> *)&local_94.__val_);
        }
        else {
          iVar3 = (iVar1 - local_80.__val_.super_SDL_Rect.x) - local_94.__val_.super_SDL_Rect.w;
          if ((flip & 1U) == 0) {
            iVar3 = local_80.__val_.super_SDL_Rect.x;
          }
          local_80.__val_.super_SDL_Rect.y = local_6c;
          local_70 = 1;
          local_84 = 1;
          local_3c.__null_state_ = '\0';
          local_34 = 0;
          local_80.__val_.super_SDL_Rect.x = iVar3;
          Copy(this,local_50,(Optional<Rect> *)&local_80.__val_,(Optional<Rect> *)&local_94.__val_,
               0.0,(Optional<Point> *)&local_3c.__val_,flip);
        }
        uVar9 = (ulong)(uVar5 + iVar1);
      } while ((int)(uVar5 + iVar1) < iVar2);
    }
    uVar4 = (int)local_58 + (int)local_60;
    local_58 = (ulong)uVar4;
  }
  return this;
}

Assistant:

Renderer& Renderer::FillCopy(Texture& texture, const Optional<Rect>& srcrect, const Optional<Rect>& dstrect, const Point& offset, int flip) {
	// resolve rectangles
	Rect src = srcrect ? *srcrect : Rect(0, 0, texture.GetWidth(), texture.GetHeight());
	Rect dst = dstrect ? *dstrect : Rect(0, 0, GetOutputWidth(), GetOutputHeight());

	// rectangle for single tile
	Rect start_tile(
			offset.x,
			offset.y,
			src.w,
			src.h
		);

	// ensure tile is leftmost and topmost
	if (start_tile.x + start_tile.w <= 0)
		start_tile.x += (-start_tile.x) / start_tile.w * start_tile.w;
	if (start_tile.x > 0)
		start_tile.x -= (start_tile.x + start_tile.w - 1) / start_tile.w * start_tile.w;

	if (start_tile.y + start_tile.h <= 0)
		start_tile.y += (-start_tile.y) / start_tile.h * start_tile.h;
	if (start_tile.y > 0)
		start_tile.y -= (start_tile.y + start_tile.h - 1) / start_tile.h * start_tile.h;

	// paint tile array
	for (int y = start_tile.y; y < dst.h; y += start_tile.h) {
		for (int x = start_tile.x; x < dst.w; x += start_tile.w) {
			Rect tile_src = src;
			Rect tile_dst(x, y, start_tile.w, start_tile.h);

			// clamp with dstrect
			int xunderflow = -x;
			if (xunderflow > 0) {
				tile_src.w -= xunderflow;
				tile_src.x += xunderflow;
				tile_dst.w -= xunderflow;
				tile_dst.x += xunderflow;
			}

			int yunderflow = -y;
			if (yunderflow > 0) {
				tile_src.h -= yunderflow;
				tile_src.y += yunderflow;
				tile_dst.h -= yunderflow;
				tile_dst.y += yunderflow;
			}

			int xoverflow = tile_dst.x + tile_dst.w - dst.w;
			if (xoverflow > 0) {
				tile_src.w -= xoverflow;
				tile_dst.w -= xoverflow;
			}

			int yoverflow = tile_dst.y + tile_dst.h - dst.h;
			if (yoverflow > 0) {
				tile_src.h -= yoverflow;
				tile_dst.h -= yoverflow;
			}

			// make tile_dst absolute
			tile_dst.x += dst.x;
			tile_dst.y += dst.y;

			if (flip != 0) {
				// mirror tile_src inside src to take flipping into account
				if (flip & SDL_FLIP_HORIZONTAL)
					tile_src.x = src.w - tile_src.x - tile_src.w;

				if (flip & SDL_FLIP_VERTICAL)
					tile_src.y = src.h - tile_src.y - tile_src.h;

				Copy(texture, tile_src, tile_dst, 0.0, NullOpt, flip);
			} else {
				Copy(texture, tile_src, tile_dst);
			}
		}
	}
	return *this;
}